

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O0

int __thiscall
FormatTypeHFE::LoadDisk
          (FormatTypeHFE *this,char *file_path,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  FILE *__stream;
  ulong uVar1;
  void *__ptr;
  size_t sVar2;
  uchar *buffer;
  uint size;
  FILE *file;
  int return_value;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  char *file_path_local;
  FormatTypeHFE *this_local;
  
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    file._4_4_ = -1;
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    rewind(__stream);
    __ptr = operator_new__(uVar1 & 0xffffffff);
    sVar2 = fread(__ptr,1,uVar1 & 0xffffffff,__stream);
    if (sVar2 == (uVar1 & 0xffffffff)) {
      file._4_4_ = (*(this->super_FormatType)._vptr_FormatType[8])
                             (this,__ptr,uVar1 & 0xffffffff,created_disk,loading_progress);
    }
    else {
      file._4_4_ = -1;
    }
    if (__ptr != (void *)0x0) {
      operator_delete__(__ptr);
    }
    fclose(__stream);
  }
  return file._4_4_;
}

Assistant:

int FormatTypeHFE::LoadDisk(const char* file_path, IDisk*& created_disk, ILoadingProgress* loading_progress)
{
   int return_value = -1;
   FILE* file;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      // Read whole file
      fseek(file, 0, SEEK_END);
      unsigned int size = ftell(file);
      rewind(file);
      unsigned char* buffer = new unsigned char[size];
      if (fread(buffer, 1, size, file) == size)
      {
         return_value = LoadDisk(buffer, size, created_disk, loading_progress);
      }
      else
      {
         return_value = FILE_ERROR;
      }
      delete[]buffer;

      fclose(file);
   }
   else
   {
      // Erreur : File not found
      return_value = FILE_ERROR;
   }
   return return_value;
}